

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O2

void __thiscall
efsw::FileWatcherInotify::checkForNewWatcher(FileWatcherInotify *this,Watcher *watch,string *fpath)

{
  bool bVar1;
  __type _Var2;
  _Base_ptr p_Var3;
  WatcherInotify *iWatch;
  Lock lock;
  Lock local_30;
  
  FileSystem::dirAddSlashAtEnd(fpath);
  if ((watch->Recursive == true) && (bVar1 = FileSystem::isDirectory(fpath), bVar1)) {
    local_30.mMutex = &this->mWatchesLock;
    Mutex::lock(local_30.mMutex);
    for (p_Var3 = (this->mWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->mWatches)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &(p_Var3[1]._M_parent)->_M_left,fpath);
      if (_Var2) {
        Lock::~Lock(&local_30);
        return;
      }
    }
    Lock::~Lock(&local_30);
    addWatch(this,fpath,watch->Listener,watch->Recursive,
             (bool)watch[1].OldFileName.field_2._M_local_buf[8],(WatcherInotify *)watch,true);
  }
  return;
}

Assistant:

void FileWatcherInotify::checkForNewWatcher( Watcher* watch, std::string fpath ) {
	FileSystem::dirAddSlashAtEnd( fpath );

	/// If the watcher is recursive, checks if the new file is a folder, and creates a watcher
	if ( watch->Recursive && FileSystem::isDirectory( fpath ) ) {
		bool found = false;

		{
			Lock lock( mWatchesLock );

			/// First check if exists
			for ( WatchMap::iterator it = mWatches.begin(); it != mWatches.end(); ++it ) {
				if ( it->second->Directory == fpath ) {
					found = true;
					break;
				}
			}
		}

		if ( !found ) {
			WatcherInotify* iWatch = static_cast<WatcherInotify*>( watch );
			addWatch( fpath, watch->Listener, watch->Recursive, iWatch->syntheticEvents,
					  static_cast<WatcherInotify*>( watch ), true );
		}
	}
}